

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_req.cxx
# Opt level: O1

ptr<snapshot_sync_req> __thiscall
cornerstone::snapshot_sync_req::deserialize(snapshot_sync_req *this,buffer *buf)

{
  byte bVar1;
  _func_int **pp_Var2;
  byte *__src;
  size_t sVar3;
  size_t sVar4;
  byte *__dest;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  ptr<snapshot_sync_req> pVar6;
  bufptr b;
  ptr<snapshot> snp;
  undefined8 local_58;
  buffer *pbStack_50;
  _func_int **local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  snapshot::deserialize((snapshot *)&local_40,buf);
  pp_Var2 = (_func_int **)buffer::get_ulong(buf);
  bVar1 = buffer::get_byte(buf);
  __src = buffer::data(buf);
  sVar3 = buffer::pos(buf);
  sVar4 = buffer::size(buf);
  if (sVar3 < sVar4) {
    sVar3 = buffer::size(buf);
    sVar4 = buffer::pos(buf);
    buffer::alloc((buffer *)&local_58,sVar3 - sVar4);
    __dest = buffer::data(pbStack_50);
    memcpy(__dest,__src,sVar3 - sVar4);
    (this->snapshot_).super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
  }
  else {
    buffer::alloc((buffer *)&local_58,0);
    (this->snapshot_).super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
  }
  p_Var5->_M_use_count = 1;
  p_Var5->_M_weak_count = 1;
  p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001796b0;
  p_Var5[1]._vptr__Sp_counted_base = local_40;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&p_Var5[1]._M_use_count = local_38;
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_38->_M_use_count = local_38->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_38->_M_use_count = local_38->_M_use_count + 1;
    }
  }
  p_Var5[2]._vptr__Sp_counted_base = pp_Var2;
  p_Var5[2]._M_use_count = (undefined4)local_58;
  p_Var5[2]._M_weak_count = local_58._4_4_;
  p_Var5[3]._vptr__Sp_counted_base = (_func_int **)pbStack_50;
  pbStack_50 = (buffer *)0x0;
  *(bool *)&p_Var5[3]._M_use_count = bVar1 == '\x01';
  (this->snapshot_).super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var5;
  (this->snapshot_).super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var5 + 1);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    local_38 = extraout_RDX;
  }
  pVar6.super___shared_ptr<cornerstone::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_38;
  pVar6.super___shared_ptr<cornerstone::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this
  ;
  return (ptr<snapshot_sync_req>)
         pVar6.super___shared_ptr<cornerstone::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<snapshot_sync_req> snapshot_sync_req::deserialize(buffer& buf)
{
    ptr<snapshot> snp(snapshot::deserialize(buf));
    ulong offset = buf.get_ulong();
    bool done = buf.get_byte() == 1;
    byte* src = buf.data();
    if (buf.pos() < buf.size())
    {
        size_t sz = buf.size() - buf.pos();
        bufptr b = buffer::alloc(sz);
        ::memcpy(b->data(), src, sz);
        return cs_new<snapshot_sync_req>(snp, offset, std::move(b), done);
    }
    else
    {
        return cs_new<snapshot_sync_req>(snp, offset, buffer::alloc(0), done);
    }
}